

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O2

void __thiscall WSNTopologyBasedEnergy::LinkNodeEachLayer(WSNTopologyBasedEnergy *this)

{
  const_iterator __position;
  WSNTopologyBasedEnergy *pWVar1;
  pointer pWVar2;
  vector<WSNNode,_std::allocator<WSNNode>_> *this_00;
  int iVar3;
  int iVar4;
  pointer pWVar5;
  long lVar6;
  allocator<char> local_1d1;
  WSNTopologyBasedEnergy *local_1d0;
  vector<WSNNode,_std::allocator<WSNNode>_> temp1;
  const_iterator local_1b0;
  _InputArray local_1a8;
  WSNNode *local_190;
  vector<WSNNode,_std::allocator<WSNNode>_> *local_188;
  vector<WSNNode,_std::allocator<WSNNode>_> *local_180;
  long local_178;
  ulong local_170;
  double local_168;
  double local_160;
  undefined8 local_158;
  undefined8 local_150;
  WSNNode local_148;
  WSNNode local_110;
  WSNNode local_d8;
  WSNNode local_a0;
  WSNNode local_68;
  
  temp1.super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  temp1.super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  temp1.super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_180 = this->layer;
  local_188 = this->LayerLeaderSeq;
  local_190 = this->LayerFirstLinkNode;
  lVar6 = 0;
  local_1d0 = this;
  while (lVar6 != 5) {
    std::vector<WSNNode,_std::allocator<WSNNode>_>::operator=(&temp1,local_180 + lVar6);
    pWVar2 = temp1.super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pWVar5 = temp1.super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = local_188 + lVar6;
    std::vector<WSNNode,_std::allocator<WSNNode>_>::clear(this_00);
    local_178 = lVar6;
    std::vector<WSNNode,_std::allocator<WSNNode>_>::push_back(this_00,local_190 + lVar6);
    local_170 = (ulong)((int)(((long)pWVar2 - (long)pWVar5) / 0x38) + 1);
    while( true ) {
      __position._M_current =
           (this_00->super__Vector_base<WSNNode,_std::allocator<WSNNode>_>)._M_impl.
           super__Vector_impl_data._M_start;
      if (local_170 <=
          (ulong)(((long)(this_00->super__Vector_base<WSNNode,_std::allocator<WSNNode>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)__position._M_current) / 0x38))
      break;
      WSNNode::WSNNode(&local_148,
                       temp1.super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
                       super__Vector_impl_data._M_start);
      local_1b0._M_current = (WSNNode *)0x0;
      for (pWVar5 = temp1.super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pWVar5 != temp1.super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
                    super__Vector_impl_data._M_finish; pWVar5 = pWVar5 + 1) {
        WSNNode::WSNNode(&local_a0,
                         (this_00->super__Vector_base<WSNNode,_std::allocator<WSNNode>_>)._M_impl.
                         super__Vector_impl_data._M_finish + -1);
        WSNNode::WSNNode(&local_d8,pWVar5);
        iVar4 = local_a0.x - local_d8.x;
        iVar3 = local_a0.y - local_d8.y;
        WSNNode::WSNNode(&local_110,
                         (this_00->super__Vector_base<WSNNode,_std::allocator<WSNNode>_>)._M_impl.
                         super__Vector_impl_data._M_finish + -1);
        WSNNode::WSNNode(&local_68,&local_148);
        local_160 = SQRT((double)(iVar3 * iVar3 + iVar4 * iVar4));
        local_168 = SQRT((double)((local_110.y - local_68.y) * (local_110.y - local_68.y) +
                                 (local_110.x - local_68.x) * (local_110.x - local_68.x)));
        WSNNode::~WSNNode(&local_68);
        WSNNode::~WSNNode(&local_110);
        WSNNode::~WSNNode(&local_d8);
        WSNNode::~WSNNode(&local_a0);
        if (local_160 <= local_168) {
          local_148.leaderID = pWVar5->leaderID;
          local_148.id = pWVar5->id;
          local_148.x = pWVar5->x;
          local_148.y = pWVar5->y;
          local_148.energy = pWVar5->energy;
          local_148.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pWVar5->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          local_148.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pWVar5->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
          local_148.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (pWVar5->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
          local_148.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (pWVar5->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
          local_1b0._M_current = pWVar5;
        }
      }
      std::vector<WSNNode,_std::allocator<WSNNode>_>::push_back(this_00,&local_148);
      std::vector<WSNNode,_std::allocator<WSNNode>_>::erase(&temp1,local_1b0);
      WSNNode::~WSNNode(&local_148);
    }
    std::vector<WSNNode,_std::allocator<WSNNode>_>::erase(this_00,__position);
    pWVar5 = (this_00->super__Vector_base<WSNNode,_std::allocator<WSNNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    while (this = local_1d0,
          pWVar5 != (this_00->super__Vector_base<WSNNode,_std::allocator<WSNNode>_>)._M_impl.
                    super__Vector_impl_data._M_finish + -1) {
      local_1a8.sz.width = 0;
      local_1a8.sz.height = 0;
      local_1a8.flags = 0x3010000;
      local_1a8.obj = local_1d0;
      local_150._0_4_ = pWVar5->x;
      local_150._4_4_ = pWVar5->y;
      local_158._0_4_ = pWVar5[1].x;
      local_158._4_4_ = pWVar5[1].y;
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_148);
      local_148.x = 0;
      local_148.y = 0x40636000;
      local_148.energy = 155.0;
      local_148.leaderID = 0;
      local_148.id = 0x40636000;
      local_148.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
      cv::line(&local_1a8,&local_150,&local_158,&local_148,1,8,0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"WSN",&local_1d1);
      pWVar1 = local_1d0;
      local_1a8.sz.width = 0;
      local_1a8.sz.height = 0;
      local_1a8.flags = 0x1010000;
      local_1a8.obj = local_1d0;
      cv::imshow((string *)&local_148,&local_1a8);
      pWVar5 = pWVar5 + 1;
      std::__cxx11::string::~string((string *)&local_148);
      if (pWVar1->Test == true) {
        cv::waitKey(0x1e);
      }
    }
    if (local_1d0->Test == true) {
      cv::waitKey(200);
    }
    lVar6 = local_178 + 1;
  }
  if (this->Test != false) {
    cv::waitKey(0);
  }
  std::vector<WSNNode,_std::allocator<WSNNode>_>::~vector(&temp1);
  return;
}

Assistant:

void WSNTopologyBasedEnergy::LinkNodeEachLayer()
{
	vector<WSNNode> temp1;

	for(int i=0;i<LayerNum;i++)
	{
		temp1=layer[i];
		int temp1cap=temp1.size();
		LayerLeaderSeq[i].clear();
		LayerLeaderSeq[i].push_back(LayerFirstLinkNode[i]);
		vector<WSNNode>::iterator it;


		//生成距离数组
		while( LayerLeaderSeq[i].size() < (unsigned int)(temp1cap+1))
		{
			WSNNode NextNode=*(temp1.begin());
			vector<WSNNode>::iterator p;

			for(it=temp1.begin();it!=temp1.end();it++)
			{
				if( DistanceBetweenNodes(*(LayerLeaderSeq[i].end()-1) ,*it) <= 
					DistanceBetweenNodes(*(LayerLeaderSeq[i].end()-1),NextNode)  )
				{
					NextNode=*it;	
					p=it;
				}
			}

			LayerLeaderSeq[i].push_back(NextNode);
			temp1.erase(p);
		}


		//成链
		LayerLeaderSeq[i].erase(LayerLeaderSeq[i].begin());

		for(it=LayerLeaderSeq[i].begin();it!=LayerLeaderSeq[i].end()-1;it++)
		{
			line(img, Point(it->x,it->y), Point((it+1)->x,(it+1)->y), Scalar(155,155,155),1,8,0);  
			imshow("WSN",img);
			if(true==Test) waitKey(30);
		}
		if(true==Test) waitKey(200);
	}
	if(true==Test) waitKey();
}